

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O2

void __thiscall QStorageInfo::setPath(QStorageInfo *this,QString *path)

{
  bool bVar1;
  
  bVar1 = ::comparesEqual(&((this->d).d.ptr)->rootPath,path);
  if (bVar1) {
    return;
  }
  QExplicitlySharedDataPointer<QStorageInfoPrivate>::detach(&this->d);
  QString::operator=(&((this->d).d.ptr)->rootPath,path);
  QStorageInfoPrivate::doStat((this->d).d.ptr);
  return;
}

Assistant:

void QStorageInfo::setPath(const QString &path)
{
    if (d->rootPath == path)
        return;
    d.detach();
    d->rootPath = path;
    d->doStat();
}